

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O0

DOMNode * __thiscall
xercesc_4_0::DOMAttrMapImpl::removeNamedItemNS
          (DOMAttrMapImpl *this,XMLCh *namespaceURI,XMLCh *localName)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DOMException *pDVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  DOMNode *p;
  undefined4 extraout_var_03;
  DOMNodeImpl *pDVar5;
  undefined4 extraout_var_04;
  long *plVar6;
  undefined8 uVar7;
  DOMNode *local_e0;
  MemoryManager *local_d8;
  DOMDocumentImpl *local_c8;
  long local_b8;
  MemoryManager *local_a8;
  MemoryManager *local_98;
  DOMDocumentImpl *local_88;
  long local_78;
  MemoryManager *local_68;
  DOMAttr *newAttr;
  DOMAttr *attr;
  DOMAttrMapImpl *defAttrs;
  DOMNode *removed;
  int i;
  XMLCh *localName_local;
  XMLCh *namespaceURI_local;
  DOMAttrMapImpl *this_local;
  
  bVar1 = readOnly(this);
  if (bVar1) {
    pDVar4 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fOwnerNode == (DOMNode *)0x0) {
      local_68 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var,iVar2) == 0) {
        local_78 = 0;
      }
      else {
        local_78 = CONCAT44(extraout_var,iVar2) + -8;
      }
      if (local_78 == 0) {
        local_98 = XMLPlatformUtils::fgMemoryManager;
      }
      else {
        iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        if (CONCAT44(extraout_var_00,iVar2) == 0) {
          local_88 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_88 = (DOMDocumentImpl *)(CONCAT44(extraout_var_00,iVar2) + -8);
        }
        local_98 = DOMDocumentImpl::getMemoryManager(local_88);
      }
      local_68 = local_98;
    }
    DOMException::DOMException(pDVar4,7,0,local_68);
    __cxa_throw(pDVar4,&DOMException::typeinfo,DOMException::~DOMException);
  }
  iVar2 = (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[0xf])(this,namespaceURI,localName);
  if (-1 < iVar2) {
    p = DOMNodeVector::elementAt(this->fNodes,(long)iVar2);
    DOMNodeVector::removeElementAt(this->fNodes,(long)iVar2);
    iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
    local_e0 = (DOMNode *)0x0;
    if (CONCAT44(extraout_var_03,iVar2) != 0) {
      local_e0 = (DOMNode *)(CONCAT44(extraout_var_03,iVar2) + 0x18);
    }
    pDVar5 = xercesc_4_0::castToNodeImpl(p);
    pDVar5->fOwnerNode = local_e0;
    pDVar5 = xercesc_4_0::castToNodeImpl(p);
    DOMNodeImpl::isOwned(pDVar5,false);
    uVar3 = (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[0xc])();
    if (((uVar3 & 1) != 0) && (p != (DOMNode *)0x0)) {
      iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0x4a])();
      plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar2) + 0x38))
                                 ((long *)CONCAT44(extraout_var_04,iVar2),namespaceURI,localName);
      if (plVar6 != (long *)0x0) {
        uVar7 = (**(code **)(*plVar6 + 0x68))(plVar6,1);
        (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[8])(this,uVar7);
      }
    }
    return p;
  }
  pDVar4 = (DOMException *)__cxa_allocate_exception(0x28);
  if (this->fOwnerNode == (DOMNode *)0x0) {
    local_a8 = XMLPlatformUtils::fgMemoryManager;
  }
  else {
    iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
    if (CONCAT44(extraout_var_01,iVar2) == 0) {
      local_b8 = 0;
    }
    else {
      local_b8 = CONCAT44(extraout_var_01,iVar2) + -8;
    }
    if (local_b8 == 0) {
      local_d8 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var_02,iVar2) == 0) {
        local_c8 = (DOMDocumentImpl *)0x0;
      }
      else {
        local_c8 = (DOMDocumentImpl *)(CONCAT44(extraout_var_02,iVar2) + -8);
      }
      local_d8 = DOMDocumentImpl::getMemoryManager(local_c8);
    }
    local_a8 = local_d8;
  }
  DOMException::DOMException(pDVar4,8,0,local_a8);
  __cxa_throw(pDVar4,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMNode *DOMAttrMapImpl::removeNamedItemNS(const XMLCh *namespaceURI, const XMLCh *localName)
{
    if (this->readOnly())
        throw DOMException(
        DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNamedNodeMapMemoryManager);
    int i = findNamePoint(namespaceURI, localName);
    if (i < 0)
        throw DOMException(DOMException::NOT_FOUND_ERR, 0, GetDOMNamedNodeMapMemoryManager);

    DOMNode * removed = fNodes -> elementAt(i);
    fNodes -> removeElementAt(i);	//remove n from nodes
    castToNodeImpl(removed)->fOwnerNode = fOwnerNode->getOwnerDocument();
    castToNodeImpl(removed)->isOwned(false);

    // Replace it if it had a default value
    // (DOM spec level 2 - Element Interface)

    if (hasDefaults() && (removed != 0))
    {
        DOMAttrMapImpl* defAttrs = ((DOMElementImpl*)fOwnerNode)->getDefaultAttributes();
        DOMAttr* attr = (DOMAttr*)(defAttrs->getNamedItemNS(namespaceURI, localName));
        if (attr != 0)
        {
            DOMAttr* newAttr = (DOMAttr*)attr->cloneNode(true);
            setNamedItemNS(newAttr);
        }
    }

    return removed;
}